

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

void fio_listen_on_data(intptr_t uuid,fio_protocol_s *pr_)

{
  intptr_t iVar1;
  int iVar2;
  
  iVar2 = 4;
  do {
    iVar1 = fio_accept(uuid);
    if (iVar1 == -1) {
      return;
    }
    (*pr_[1].on_shutdown)(iVar1,(fio_protocol_s *)pr_[1].on_ready);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  return;
}

Assistant:

static void fio_listen_on_data(intptr_t uuid, fio_protocol_s *pr_) {
  fio_listen_protocol_s *pr = (fio_listen_protocol_s *)pr_;
  for (int i = 0; i < 4; ++i) {
    intptr_t client = fio_accept(uuid);
    if (client == -1)
      return;
    pr->on_open(client, pr->udata);
  }
}